

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddSLessThan(InstructionBuilder *this,uint32_t op1,uint32_t op2)

{
  IRContext *this_00;
  uint32_t ty_id;
  uint32_t res_id;
  TypeManager *this_01;
  Instruction *pIVar1;
  long lVar2;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_130;
  uint32_t local_128;
  uint32_t local_124;
  undefined1 local_120 [48];
  undefined4 local_f0;
  SmallVector<unsigned_int,_2UL> local_e8;
  SmallVector<unsigned_int,_2UL> local_c0;
  SmallVector<unsigned_int,_2UL> local_98;
  Bool bool_type;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bool_type.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bool_type.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bool_type.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bool_type.super_Type.kind_ = kBool;
  bool_type.super_Type._vptr_Type = (_func_int **)&PTR__Type_00a68f28;
  this_01 = IRContext::get_type_mgr(this->context_);
  ty_id = analysis::TypeManager::GetId(this_01,&bool_type.super_Type);
  pIVar1 = (Instruction *)::operator_new(0x70);
  this_00 = this->context_;
  res_id = IRContext::TakeNextId(this_00);
  init_list._M_len = 1;
  init_list._M_array = &local_124;
  local_124 = op1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_98,init_list);
  local_120._0_4_ = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_120 + 8),&local_98);
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_128;
  local_128 = op2;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0,init_list_00);
  local_f0 = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e8,&local_c0);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
             local_120,&local_c0);
  Instruction::Instruction(pIVar1,this_00,OpSLessThan,ty_id,res_id,(OperandList *)&local_48);
  local_130._M_head_impl = pIVar1;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48);
  lVar2 = 0x38;
  do {
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_120 + lVar2));
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != -0x28);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_98);
  pIVar1 = AddInstruction(this,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)&local_130);
  if (local_130._M_head_impl != (Instruction *)0x0) {
    (*((local_130._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  analysis::Type::~Type(&bool_type.super_Type);
  return pIVar1;
}

Assistant:

Instruction* AddSLessThan(uint32_t op1, uint32_t op2) {
    analysis::Bool bool_type;
    uint32_t type = GetContext()->get_type_mgr()->GetId(&bool_type);
    // TODO(1841): Handle id overflow.
    std::unique_ptr<Instruction> inst(new Instruction(
        GetContext(), spv::Op::OpSLessThan, type, GetContext()->TakeNextId(),
        {{SPV_OPERAND_TYPE_ID, {op1}}, {SPV_OPERAND_TYPE_ID, {op2}}}));
    return AddInstruction(std::move(inst));
  }